

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SliceDynamicLayerParams::SliceDynamicLayerParams
          (SliceDynamicLayerParams *this,SliceDynamicLayerParams *from)

{
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SliceDynamicLayerParams_0076c2e8
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  google::protobuf::RepeatedField<bool>::RepeatedField(&this->beginmasks_,&from->beginmasks_);
  google::protobuf::RepeatedField<long>::RepeatedField(&this->endids_,&from->endids_);
  google::protobuf::RepeatedField<bool>::RepeatedField(&this->endmasks_,&from->endmasks_);
  google::protobuf::RepeatedField<long>::RepeatedField(&this->strides_,&from->strides_);
  google::protobuf::RepeatedField<bool>::RepeatedField(&this->squeezemasks_,&from->squeezemasks_);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

SliceDynamicLayerParams::SliceDynamicLayerParams(const SliceDynamicLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      beginmasks_(from.beginmasks_),
      endids_(from.endids_),
      endmasks_(from.endmasks_),
      strides_(from.strides_),
      squeezemasks_(from.squeezemasks_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SliceDynamicLayerParams)
}